

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O2

void __thiscall hrgls::StreamProperties::StreamProperties(StreamProperties *this)

{
  element_type *peVar1;
  mapped_type mVar2;
  StreamProperties_private *__p;
  mapped_type *pmVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Rb_tree_header *p_Var5;
  hrgls_StreamProperties_ *__tmp;
  __allocator_type __a2;
  hrgls_StreamProperties ptr;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<hrgls_StreamProperties__*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ReliaSolve[P]Hourglass_hrgls_api_hpp:59:7),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_48;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  (this->m_private).
  super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_private).
  super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (StreamProperties_private *)operator_new(0x40);
  (__p->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var5 = &(__p->m_status)._M_t._M_impl.super__Rb_tree_header;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>::
  reset<hrgls::StreamProperties::StreamProperties_private>
            ((__shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
              *)this,__p);
  mVar2 = hrgls_StreamPropertiesCreate(&ptr);
  peVar1 = (this->m_private).
           super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_48._M_alloc =
       (allocator<std::_Sp_counted_deleter<hrgls_StreamProperties__*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ReliaSolve[P]Hourglass_hrgls_api_hpp:59:7),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
        *)pthread_self();
  pmVar3 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&peVar1->m_status,(key_type *)&local_48);
  *pmVar3 = mVar2;
  peVar1 = (this->m_private).
           super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_48._M_alloc = &__a2;
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_0010ad30;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)ptr;
  local_48._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<hrgls_StreamProperties__*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ReliaSolve[P]Hourglass/hrgls_api.hpp:59:7),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_48);
  local_38 = (peVar1->m_state).
             super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       ptr;
  local_30._M_pi =
       (peVar1->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (peVar1->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

StreamProperties::StreamProperties()
  {
    // Create our private data object
    m_private.reset(new StreamProperties_private);
    hrgls_StreamProperties ptr;
    m_private->m_status[std::this_thread::get_id()] = hrgls_StreamPropertiesCreate(&ptr);
    m_private->m_state.reset(ptr,
      [](hrgls_StreamProperties_ *obj) {hrgls_StreamPropertiesDestroy(obj); }
      );
  }